

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  int *piVar4;
  int32_t iVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  DataKey DVar9;
  long lVar10;
  undefined4 *puVar11;
  uint *puVar12;
  pointer pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  pointer pnVar16;
  devexpr *pdVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  long lVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_4ec;
  undefined1 local_4c8 [32];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [13];
  undefined3 uStack_45b;
  int iStack_458;
  bool bStack_454;
  undefined8 local_450;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  DIdxSet *local_440;
  pointer local_438;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  devexpr local_230 [112];
  int local_1c0;
  byte local_1bc;
  fpclass_type local_1b8;
  int32_t iStack_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar21 = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_3b0,-1,(type *)0x0);
  local_450._0_4_ = cpp_dec_float_finite;
  local_450._4_4_ = 0x1c;
  local_4c8._0_16_ = (undefined1  [16])0x0;
  local_4c8._16_16_ = (undefined1  [16])0x0;
  local_4a8 = (undefined1  [16])0x0;
  local_498 = (undefined1  [16])0x0;
  local_488 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  local_468 = SUB1613((undefined1  [16])0x0,0);
  uStack_45b = 0;
  iStack_458 = 0;
  bStack_454 = false;
  lVar20 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar20 < 1) {
    local_4ec = -1;
  }
  else {
    lVar20 = lVar20 + 1;
    local_4ec = -1;
    do {
      iVar8 = (this->bestPrices).super_IdxSet.idx[lVar20 + -2];
      pnVar16 = pnVar2 + iVar8;
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar15->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
      }
      iStack_458 = pnVar2[iVar8].m_backend.exp;
      bStack_454 = pnVar2[iVar8].m_backend.neg;
      local_450._0_4_ = pnVar2[iVar8].m_backend.fpclass;
      local_450._4_4_ = pnVar2[iVar8].m_backend.prec_elem;
      pnVar14 = feastol;
      pcVar15 = &local_430;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar15->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_430.exp = (feastol->m_backend).exp;
      local_430.neg = (feastol->m_backend).neg;
      local_430.fpclass = (feastol->m_backend).fpclass;
      local_430.prec_elem = (feastol->m_backend).prec_elem;
      if (local_430.data._M_elems[0] != 0 || local_430.fpclass != cpp_dec_float_finite) {
        local_430.neg = (bool)(local_430.neg ^ 1);
      }
      if (local_430.fpclass == cpp_dec_float_NaN || (fpclass_type)local_450 == cpp_dec_float_NaN) {
LAB_005adc65:
        piVar4 = (this->bestPrices).super_IdxSet.idx;
        iVar7 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar7 + -1;
        piVar4[lVar20 + -2] = piVar4[(long)iVar7 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar8] = 0;
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_430);
        if (-1 < iVar7) goto LAB_005adc65;
        puVar11 = (undefined4 *)local_4c8;
        pdVar17 = local_b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(undefined4 *)pdVar17 = *puVar11;
          puVar11 = puVar11 + (ulong)bVar21 * -2 + 1;
          pdVar17 = pdVar17 + (ulong)bVar21 * -8 + 4;
        }
        local_40 = iStack_458;
        local_3c = bStack_454;
        local_38 = (fpclass_type)local_450;
        iStack_34 = local_450._4_4_;
        pnVar16 = pnVar3 + iVar8;
        pnVar13 = pnVar16;
        pnVar14 = &local_130;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar3[iVar8].m_backend.exp;
        local_130.m_backend.neg = pnVar3[iVar8].m_backend.neg;
        local_130.m_backend.fpclass = pnVar3[iVar8].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar3[iVar8].m_backend.prec_elem;
        pnVar14 = feastol;
        pnVar18 = &local_1b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_430,local_b0,&local_130,&local_1b0,&local_130);
        pcVar15 = &local_430;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar19->data)._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0];
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar21 * -2 + 1) * 4)
          ;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar21 * -8 + 4);
        }
        iStack_458 = local_430.exp;
        bStack_454 = local_430.neg;
        local_450._0_4_ = local_430.fpclass;
        local_450._4_4_ = local_430.prec_elem;
        if ((local_430.fpclass != cpp_dec_float_NaN) &&
           ((best->m_backend).fpclass != cpp_dec_float_NaN)) {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4c8,&best->m_backend);
          if (0 < iVar7) {
            puVar12 = (uint *)local_4c8;
            pnVar14 = best;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = *puVar12;
              puVar12 = puVar12 + (ulong)bVar21 * -2 + 1;
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            (best->m_backend).exp = iStack_458;
            (best->m_backend).neg = bStack_454;
            (best->m_backend).fpclass = (fpclass_type)local_450;
            (best->m_backend).prec_elem = local_450._4_4_;
            pnVar13 = pnVar16;
            pnVar14 = &this->last;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
              pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + (ulong)bVar21 * -8 + 4);
            }
            (this->last).m_backend.exp = (pnVar16->m_backend).exp;
            (this->last).m_backend.neg = (pnVar16->m_backend).neg;
            iVar5 = (pnVar16->m_backend).prec_elem;
            (this->last).m_backend.fpclass = (pnVar16->m_backend).fpclass;
            (this->last).m_backend.prec_elem = iVar5;
            local_4ec = iVar8;
          }
        }
        if ((((fpclass_type)local_450 == cpp_dec_float_NaN) ||
            (local_3b0.fpclass == cpp_dec_float_NaN)) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_3b0), -1 < iVar8))
        {
          if (local_3b0.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_430,0,(type *)0x0);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3b0,&local_430);
            if (iVar8 < 0) goto LAB_005adeb1;
          }
        }
        else {
LAB_005adeb1:
          puVar12 = (uint *)local_4c8;
          pcVar15 = &local_3b0;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar15->data)._M_elems[0] = *puVar12;
            puVar12 = puVar12 + (ulong)bVar21 * -2 + 1;
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_3b0.exp = iStack_458;
          local_3b0.neg = bStack_454;
          local_3b0.fpclass = (fpclass_type)local_450;
          local_3b0.prec_elem = local_450._4_4_;
        }
      }
      lVar20 = lVar20 + -1;
    } while (1 < lVar20);
  }
  lVar20 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->updateViols).super_IdxSet.num;
  if (0 < lVar20) {
    local_440 = &this->bestPrices;
    local_448 = &this->last;
    lVar20 = lVar20 + 1;
    do {
      pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar8 = (pSVar1->updateViols).super_IdxSet.idx[lVar20 + -2];
      uVar6 = local_450;
      if ((pSVar1->isInfeasible).data[iVar8] == 1) {
        pnVar16 = pnVar2 + iVar8;
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar15->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
        }
        iStack_458 = pnVar2[iVar8].m_backend.exp;
        bStack_454 = pnVar2[iVar8].m_backend.neg;
        local_450._0_4_ = pnVar2[iVar8].m_backend.fpclass;
        local_450._4_4_ = pnVar2[iVar8].m_backend.prec_elem;
        pnVar14 = feastol;
        pcVar15 = &local_430;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar15->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
        }
        local_430.exp = (feastol->m_backend).exp;
        local_430.neg = (feastol->m_backend).neg;
        local_430.fpclass = (feastol->m_backend).fpclass;
        local_430.prec_elem = (feastol->m_backend).prec_elem;
        if (local_430.data._M_elems[0] != 0 || local_430.fpclass != cpp_dec_float_finite) {
          local_430.neg = (bool)(local_430.neg ^ 1);
        }
        if (local_430.fpclass != cpp_dec_float_NaN && (fpclass_type)local_450 != cpp_dec_float_NaN)
        {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_430);
          if (iVar7 < 0) {
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
            pdVar17 = local_230;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              *(uint *)pdVar17 = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
              pdVar17 = pdVar17 + (ulong)bVar21 * -8 + 4;
            }
            local_1c0 = iStack_458;
            local_1bc = bStack_454;
            local_1b8 = (fpclass_type)local_450;
            iStack_1b4 = local_450._4_4_;
            local_438 = pnVar3 + iVar8;
            pnVar16 = local_438;
            pnVar14 = &local_2b0;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
              pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_2b0.m_backend.exp = pnVar3[iVar8].m_backend.exp;
            local_2b0.m_backend.neg = pnVar3[iVar8].m_backend.neg;
            local_2b0.m_backend.fpclass = pnVar3[iVar8].m_backend.fpclass;
            local_2b0.m_backend.prec_elem = pnVar3[iVar8].m_backend.prec_elem;
            pnVar14 = feastol;
            pnVar18 = &local_330;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_330.m_backend.exp = (feastol->m_backend).exp;
            local_330.m_backend.neg = (feastol->m_backend).neg;
            local_330.m_backend.fpclass = (feastol->m_backend).fpclass;
            local_330.m_backend.prec_elem = (feastol->m_backend).prec_elem;
            devexpr::
            computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_430,local_230,&local_2b0,&local_330,&local_2b0);
            pcVar15 = &local_430;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar15 + ((ulong)bVar21 * -2 + 1) * 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar21 * -8 + 4);
            }
            iStack_458 = local_430.exp;
            bStack_454 = local_430.neg;
            uVar6._0_4_ = local_430.fpclass;
            uVar6._4_4_ = local_430.prec_elem;
            local_450._0_4_ = local_430.fpclass;
            local_450._4_4_ = local_430.prec_elem;
            if (((local_430.fpclass != cpp_dec_float_NaN) &&
                (uVar6 = local_450, local_3b0.fpclass != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_3b0),
               uVar6 = local_450, 0 < iVar7)) {
              if ((((fpclass_type)local_450 != cpp_dec_float_NaN) &&
                  ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_4c8,&best->m_backend),
                 0 < iVar7)) {
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
                pnVar14 = best;
                for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (pnVar14->m_backend).data._M_elems[0] = (pcVar15->data)._M_elems[0];
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + (ulong)bVar21 * -8 + 4);
                  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
                }
                (best->m_backend).exp = iStack_458;
                (best->m_backend).neg = bStack_454;
                (best->m_backend).fpclass = (fpclass_type)local_450;
                (best->m_backend).prec_elem = local_450._4_4_;
                pnVar16 = local_438;
                pnVar14 = local_448;
                for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (pnVar14->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
                  pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
                  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar14 + (ulong)bVar21 * -8 + 4);
                }
                (this->last).m_backend.exp = (local_438->m_backend).exp;
                (this->last).m_backend.neg = (local_438->m_backend).neg;
                iVar5 = (local_438->m_backend).prec_elem;
                (this->last).m_backend.fpclass = (local_438->m_backend).fpclass;
                (this->last).m_backend.prec_elem = iVar5;
                local_4ec = iVar8;
              }
              (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->isInfeasible).data[iVar8] = 2;
              DIdxSet::addIdx(local_440,iVar8);
              uVar6 = local_450;
            }
            goto LAB_005ae034;
          }
        }
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar8] = 0;
        uVar6 = local_450;
      }
LAB_005ae034:
      local_450 = uVar6;
      lVar20 = lVar20 + -1;
    } while (1 < lVar20);
  }
  if (local_4ec < 0) {
    DVar9.info = 0;
    DVar9.idx = -1;
  }
  else {
    DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,local_4ec);
  }
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperDim(R& best, R feastol)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = cTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indeces for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = cTest[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, cpen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = cpen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}